

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O1

bool __thiscall ON_PlaneSurface::Write(ON_PlaneSurface *this,ON_BinaryArchive *file)

{
  bool bVar1;
  
  bVar1 = ON_BinaryArchive::Write3dmChunkVersion(file,1,1);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::WritePlane(file,&this->m_plane);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteInterval(file,(ON_Interval *)&this->field_0x90);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteInterval(file,(ON_Interval *)&this->field_0xa0);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteInterval(file,(ON_Interval *)&this->field_0xb0);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteInterval(file,(ON_Interval *)&this->field_0xc0);
    return bVar1;
  }
  return false;
}

Assistant:

bool 
ON_PlaneSurface::Write(
       ON_BinaryArchive& file  // open binary file
     ) const
{
  bool rc = file.Write3dmChunkVersion(1,1);

  // version 1.0 chunks
  if (rc)
    rc = file.WritePlane( m_plane );
  if (rc)
    rc = file.WriteInterval( m_domain[0] );
  if (rc)
    rc = file.WriteInterval( m_domain[1] );
  
  // added to version 1.1 chunks
  if (rc)
    rc = file.WriteInterval( m_extents[0] );
  if (rc)
    rc = file.WriteInterval( m_extents[1] );
  return rc;
}